

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cc
# Opt level: O0

void * raptor::Malloc(size_t size)

{
  void *ptr;
  size_t size_local;
  
  if (size == 0) {
    size_local = 0;
  }
  else {
    size_local = (size_t)malloc(size);
    if ((void *)size_local == (void *)0x0) {
      abort();
    }
  }
  return (void *)size_local;
}

Assistant:

void* Malloc(size_t size) {
    if (size > 0) {
        void* ptr = ::malloc(size);
        if (!ptr) {
            abort();
        }
        return ptr;
    }
    return nullptr;
}